

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

_Bool player_inc_timed(player *p,wchar_t idx,wchar_t v,_Bool notify,_Bool can_disturb,_Bool check)

{
  _Bool _Var1;
  _Bool check_local;
  _Bool can_disturb_local;
  _Bool notify_local;
  wchar_t v_local;
  wchar_t idx_local;
  player *p_local;
  
  if (idx < L'\0') {
    __assert_fail("idx >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0x426,"_Bool player_inc_timed(struct player *, int, int, _Bool, _Bool, _Bool)");
  }
  if (idx < L'5') {
    if ((check) && (_Var1 = player_inc_check(p,idx,false), !_Var1)) {
      return false;
    }
    if (((timed_effects[idx].flags & 1) == 0) || (p->timed[idx] < 1)) {
      p_local._7_1_ = player_set_timed(p,idx,p->timed[idx] + v,notify,can_disturb);
    }
    else {
      p_local._7_1_ = false;
    }
    return p_local._7_1_;
  }
  __assert_fail("idx < TMD_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x427,"_Bool player_inc_timed(struct player *, int, int, _Bool, _Bool, _Bool)");
}

Assistant:

bool player_inc_timed(struct player *p, int idx, int v, bool notify,
		bool can_disturb, bool check)
{
	assert(idx >= 0);
	assert(idx < TMD_MAX);

	if (check == false || player_inc_check(p, idx, false) == true) {
		if ((timed_effects[idx].flags & TMD_FLAG_NONSTACKING)
				&& p->timed[idx] > 0) {
			/*
			 * Block the increase if the effect is nonstacking and
			 * already active.
			 */
			return false;
		} else {
			return player_set_timed(p,
					idx,
					p->timed[idx] + v,
					notify, can_disturb);
		}
	}

	return false;
}